

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter.hpp
# Opt level: O0

void __thiscall
ylt::metric::basic_dynamic_counter<long,_(unsigned_char)'\x01'>::basic_dynamic_counter
          (basic_dynamic_counter<long,_(unsigned_char)__x01_> *this,string *name,string *help,
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>
          *labels_name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>
  *in_RDI;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>
  *paVar1;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>
  *this_00;
  string *psVar2;
  string *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  MetricType in_stack_ffffffffffffff7c;
  _Alloc_hider in_stack_ffffffffffffff80;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>
  local_60;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>
  local_40 [2];
  
  paVar1 = local_40;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff80._M_p,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  this_00 = &local_60;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff80._M_p,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  psVar2 = (string *)&stack0xffffffffffffff80;
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>::
  array(this_00,paVar1);
  dynamic_metric_impl<std::atomic<long>,(unsigned_char)1>::metric_t<1ul>
            ((dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x01_> *)
             in_stack_ffffffffffffff80._M_p,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff70,
             psVar2,this_00);
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>::
  ~array(in_RDI);
  std::__cxx11::string::~string(in_RDX);
  std::__cxx11::string::~string(in_RDX);
  in_RDI->_M_elems[0]._M_dataplus._M_p = (pointer)&PTR__basic_dynamic_counter_00329c28;
  return;
}

Assistant:

basic_dynamic_counter(std::string name, std::string help,
                        std::array<std::string, N> labels_name)
      : Base(MetricType::Counter, std::move(name), std::move(help),
             std::move(labels_name)) {}